

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O1

void __thiscall
duckdb::SingleFileBlockManager::MarkBlockAsFree(SingleFileBlockManager *this,block_id_t block_id)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  InternalException *this_00;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  long local_50;
  string local_48;
  
  local_50 = block_id;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->block_lock);
  if (iVar2 != 0) {
    ::std::__throw_system_error(iVar2);
  }
  p_Var1 = &(this->free_list)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->free_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[*(long *)(p_Var4 + 1) < local_50]) {
    if (local_50 <= *(long *)(p_Var4 + 1)) {
      p_Var3 = p_Var4;
    }
  }
  p_Var4 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var4 = p_Var3, local_50 < *(long *)(p_Var3 + 1)))
  {
    p_Var4 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var4 == p_Var1) {
    ::std::
    _Hashtable<long,_std::pair<const_long,_unsigned_int>,_std::allocator<std::pair<const_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(&(this->multi_use_blocks)._M_h,&local_50);
    ::std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
    _M_insert_unique<long_const&>
              ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
               &this->free_list,&local_50);
    ::std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
    _M_insert_unique<long_const&>
              ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
               &this->newly_freed_list,&local_50);
    pthread_mutex_unlock((pthread_mutex_t *)&this->block_lock);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"MarkBlockAsFree called but block %llu was already freed!","");
  InternalException::InternalException<long>(this_00,&local_48,local_50);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void SingleFileBlockManager::MarkBlockAsFree(block_id_t block_id) {
	lock_guard<mutex> lock(block_lock);
	D_ASSERT(block_id >= 0);
	D_ASSERT(block_id < max_block);
	if (free_list.find(block_id) != free_list.end()) {
		throw InternalException("MarkBlockAsFree called but block %llu was already freed!", block_id);
	}
	multi_use_blocks.erase(block_id);
	free_list.insert(block_id);
	newly_freed_list.insert(block_id);
}